

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteDescriptorKey
          (WalletBatch *this,uint256 *desc_id,CPubKey *pubkey,CPrivKey *privkey)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  uint256 result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  uchar local_1e8 [40];
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> local_1c0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [72];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  local_120;
  CSHA256 local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = 0x21;
  if ((pubkey->vch[0] & 0xfe) != 2) {
    bVar2 = pubkey->vch[0] - 4;
    if (bVar2 < 4) {
      lVar4 = (&DAT_00846808)[bVar2];
    }
    else {
      lVar4 = 0;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&local_208,
             (size_type)
             ((privkey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl
              .super__Vector_impl_data._M_finish +
             (lVar4 - (long)(privkey->
                            super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start)));
  lVar4 = 0x21;
  if ((pubkey->vch[0] & 0xfe) != 2) {
    bVar2 = pubkey->vch[0] - 4;
    if (bVar2 < 4) {
      lVar4 = (&DAT_00846808)[bVar2];
    }
    else {
      lVar4 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_208,
             local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,pubkey,pubkey->vch + lVar4);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_208,
             local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (privkey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start);
  local_188 = *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  uStack_180 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_178 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_170 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  memcpy(local_168,pubkey,0x41);
  paVar1 = &local_120.first.field_2;
  local_120.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,DBKeys::WALLETDESCRIPTORKEY_abi_cxx11_,
             DAT_00b4cd18 + DBKeys::WALLETDESCRIPTORKEY_abi_cxx11_);
  memcpy(&local_120.second,&local_188,0x61);
  local_1e8[0x10] = '\0';
  local_1e8[0x11] = '\0';
  local_1e8[0x12] = '\0';
  local_1e8[0x13] = '\0';
  local_1e8[0x14] = '\0';
  local_1e8[0x15] = '\0';
  local_1e8[0x16] = '\0';
  local_1e8[0x17] = '\0';
  local_1e8[0x18] = '\0';
  local_1e8[0x19] = '\0';
  local_1e8[0x1a] = '\0';
  local_1e8[0x1b] = '\0';
  local_1e8[0x1c] = '\0';
  local_1e8[0x1d] = '\0';
  local_1e8[0x1e] = '\0';
  local_1e8[0x1f] = '\0';
  local_1e8[0] = '\0';
  local_1e8[1] = '\0';
  local_1e8[2] = '\0';
  local_1e8[3] = '\0';
  local_1e8[4] = '\0';
  local_1e8[5] = '\0';
  local_1e8[6] = '\0';
  local_1e8[7] = '\0';
  local_1e8[8] = '\0';
  local_1e8[9] = '\0';
  local_1e8[10] = '\0';
  local_1e8[0xb] = '\0';
  local_1e8[0xc] = '\0';
  local_1e8[0xd] = '\0';
  local_1e8[0xe] = '\0';
  local_1e8[0xf] = '\0';
  local_98.buf[0x30] = '\0';
  local_98.buf[0x31] = '\0';
  local_98.buf[0x32] = '\0';
  local_98.buf[0x33] = '\0';
  local_98.buf[0x34] = '\0';
  local_98.buf[0x35] = '\0';
  local_98.buf[0x36] = '\0';
  local_98.buf[0x37] = '\0';
  local_98.buf[0x38] = '\0';
  local_98.buf[0x39] = '\0';
  local_98.buf[0x3a] = '\0';
  local_98.buf[0x3b] = '\0';
  local_98.buf[0x3c] = '\0';
  local_98.buf[0x3d] = '\0';
  local_98.buf[0x3e] = '\0';
  local_98.buf[0x3f] = '\0';
  local_98.buf[0x20] = '\0';
  local_98.buf[0x21] = '\0';
  local_98.buf[0x22] = '\0';
  local_98.buf[0x23] = '\0';
  local_98.buf[0x24] = '\0';
  local_98.buf[0x25] = '\0';
  local_98.buf[0x26] = '\0';
  local_98.buf[0x27] = '\0';
  local_98.buf[0x28] = '\0';
  local_98.buf[0x29] = '\0';
  local_98.buf[0x2a] = '\0';
  local_98.buf[0x2b] = '\0';
  local_98.buf[0x2c] = '\0';
  local_98.buf[0x2d] = '\0';
  local_98.buf[0x2e] = '\0';
  local_98.buf[0x2f] = '\0';
  local_98.buf[0x10] = '\0';
  local_98.buf[0x11] = '\0';
  local_98.buf[0x12] = '\0';
  local_98.buf[0x13] = '\0';
  local_98.buf[0x14] = '\0';
  local_98.buf[0x15] = '\0';
  local_98.buf[0x16] = '\0';
  local_98.buf[0x17] = '\0';
  local_98.buf[0x18] = '\0';
  local_98.buf[0x19] = '\0';
  local_98.buf[0x1a] = '\0';
  local_98.buf[0x1b] = '\0';
  local_98.buf[0x1c] = '\0';
  local_98.buf[0x1d] = '\0';
  local_98.buf[0x1e] = '\0';
  local_98.buf[0x1f] = '\0';
  local_98.buf[0] = '\0';
  local_98.buf[1] = '\0';
  local_98.buf[2] = '\0';
  local_98.buf[3] = '\0';
  local_98.buf[4] = '\0';
  local_98.buf[5] = '\0';
  local_98.buf[6] = '\0';
  local_98.buf[7] = '\0';
  local_98.buf[8] = '\0';
  local_98.buf[9] = '\0';
  local_98.buf[10] = '\0';
  local_98.buf[0xb] = '\0';
  local_98.buf[0xc] = '\0';
  local_98.buf[0xd] = '\0';
  local_98.buf[0xe] = '\0';
  local_98.buf[0xf] = '\0';
  local_98.s[4] = 0;
  local_98.s[5] = 0;
  local_98.s[6] = 0;
  local_98.s[7] = 0;
  local_98.s[0] = 0;
  local_98.s[1] = 0;
  local_98.s[2] = 0;
  local_98.s[3] = 0;
  local_98.bytes = 0;
  CSHA256::CSHA256(&local_98);
  CSHA256::Write(&local_98,
                 local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  output.m_size = 0x20;
  output.m_data = local_1e8;
  CHash256::Finalize((CHash256 *)&local_98,output);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector(&local_1c0.first,privkey);
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x10] = local_1e8[0x10];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x11] = local_1e8[0x11];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x12] = local_1e8[0x12];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x13] = local_1e8[0x13];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x14] = local_1e8[0x14];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x15] = local_1e8[0x15];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x16] = local_1e8[0x16];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x17] = local_1e8[0x17];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x18] = local_1e8[0x18];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x19] = local_1e8[0x19];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1a] = local_1e8[0x1a];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1b] = local_1e8[0x1b];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1c] = local_1e8[0x1c];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1d] = local_1e8[0x1d];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1e] = local_1e8[0x1e];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0x1f] = local_1e8[0x1f];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0] = local_1e8[0];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[1] = local_1e8[1];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[2] = local_1e8[2];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[3] = local_1e8[3];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[4] = local_1e8[4];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[5] = local_1e8[5];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[6] = local_1e8[6];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[7] = local_1e8[7];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[8] = local_1e8[8];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[9] = local_1e8[9];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[10] = local_1e8[10];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0xb] = local_1e8[0xb];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0xc] = local_1e8[0xc];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0xd] = local_1e8[0xd];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0xe] = local_1e8[0xe];
  local_1c0.second.super_base_blob<256U>.m_data._M_elems[0xf] = local_1e8[0xf];
  bVar3 = WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                    (this,&local_120,&local_1c0,false);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorKey(const uint256& desc_id, const CPubKey& pubkey, const CPrivKey& privkey)
{
    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> key;
    key.reserve(pubkey.size() + privkey.size());
    key.insert(key.end(), pubkey.begin(), pubkey.end());
    key.insert(key.end(), privkey.begin(), privkey.end());

    return WriteIC(std::make_pair(DBKeys::WALLETDESCRIPTORKEY, std::make_pair(desc_id, pubkey)), std::make_pair(privkey, Hash(key)), false);
}